

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bgpsec.c
# Opt level: O2

int main(void)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  rtr_bgpsec_nlri *prVar5;
  rtr_bgpsec *prVar6;
  rtr_secure_path_seg *prVar7;
  rtr_signature_seg *prVar8;
  spki_record *psVar9;
  spki_record *psVar10;
  spki_record *spki_record;
  long in_FS_OFFSET;
  rtr_signature_seg *local_1b0;
  spki_table table;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prVar5 = rtr_mgr_bgpsec_nlri_new(3);
  prVar5->nlri_len = '\x18';
  prVar5->afi = 1;
  puVar2 = prVar5->nlri;
  puVar2[2] = '\x02';
  puVar2[0] = 0xc0;
  puVar2[1] = '\0';
  prVar6 = rtr_mgr_bgpsec_new('\x01','\x01',1,0x10001,0x10001,prVar5);
  prVar7 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar6,prVar7);
  prVar7 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0x10000);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar6,prVar7);
  prVar8 = rtr_mgr_bgpsec_new_signature_seg(ski2,0x48,sig2);
  iVar4 = rtr_mgr_bgpsec_prepend_sig_seg(prVar6,prVar8);
  if (iVar4 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x8f,"void validate_bgpsec_path_test(void)");
  }
  prVar8 = rtr_mgr_bgpsec_new_signature_seg(ski1,0x48,sig1);
  iVar4 = rtr_mgr_bgpsec_prepend_sig_seg(prVar6,prVar8);
  if (iVar4 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x93,"void validate_bgpsec_path_test(void)");
  }
  spki_table_init(&table,(spki_update_fp)0x0);
  psVar9 = create_record(0x10000,ski1,spki1);
  psVar10 = create_record(0xfbf0,ski2,spki2);
  spki_record = create_record(0xfbf1,ski2,spki1);
  spki_table_add_entry(&table,psVar9);
  spki_table_add_entry(&table,psVar10);
  iVar4 = rtr_bgpsec_validate_as_path(prVar6,&table);
  if (iVar4 != 1) {
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xa6,"void validate_bgpsec_path_test(void)");
  }
  memcpy(prVar6->sigs->next->signature,"0F\x02!",0x48);
  iVar4 = rtr_bgpsec_validate_as_path(prVar6,&table);
  if (iVar4 != 2) {
    __assert_fail("result == RTR_BGPSEC_NOT_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xaf,"void validate_bgpsec_path_test(void)");
  }
  memcpy(prVar6->sigs->next->signature,sig2,0x48);
  spki_table_remove_entry(&table,psVar9);
  iVar4 = rtr_bgpsec_validate_as_path(prVar6,&table);
  if (iVar4 != -4) {
    __assert_fail("result == RTR_BGPSEC_ROUTER_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xba,"void validate_bgpsec_path_test(void)");
  }
  spki_table_add_entry(&table,spki_record);
  spki_table_add_entry(&table,psVar9);
  iVar4 = rtr_bgpsec_validate_as_path(prVar6,&table);
  if (iVar4 != 1) {
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xc4,"void validate_bgpsec_path_test(void)");
  }
  prVar6->alg = '\x02';
  iVar4 = rtr_bgpsec_validate_as_path(prVar6,&table);
  if (iVar4 != -6) {
    __assert_fail("result == RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xcb,"void validate_bgpsec_path_test(void)");
  }
  spki_table_free(&table);
  free(psVar9);
  free(psVar10);
  free(spki_record);
  rtr_mgr_bgpsec_free(prVar6);
  local_1b0 = (rtr_signature_seg *)0x0;
  prVar5 = rtr_mgr_bgpsec_nlri_new(3);
  prVar5->nlri_len = '\x18';
  prVar5->afi = 1;
  puVar2 = prVar5->nlri;
  puVar2[2] = '\x02';
  puVar2[0] = 0xc0;
  puVar2[1] = '\0';
  prVar6 = rtr_mgr_bgpsec_new('\x01','\x01',1,0x10001,0x10002,prVar5);
  prVar7 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar6,prVar7);
  prVar7 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0x10000);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar6,prVar7);
  prVar8 = rtr_mgr_bgpsec_new_signature_seg(ski2,0x48,sig2);
  iVar4 = rtr_mgr_bgpsec_prepend_sig_seg(prVar6,prVar8);
  if (iVar4 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x10c,"void generate_signature_test(void)");
  }
  prVar8 = rtr_mgr_bgpsec_new_signature_seg(ski1,0x48,sig1);
  iVar4 = rtr_mgr_bgpsec_prepend_sig_seg(prVar6,prVar8);
  if (iVar4 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x110,"void generate_signature_test(void)");
  }
  prVar7 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0x10001);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar6,prVar7);
  spki_table_init(&table,(spki_update_fp)0x0);
  psVar9 = create_record(0x10000,ski1,spki1);
  psVar10 = create_record(0xfbf0,ski2,spki2);
  spki_table_add_entry(&table,psVar10);
  spki_table_add_entry(&table,psVar9);
  rtr_bgpsec_generate_signature(prVar6,private_key,&local_1b0);
  if (local_1b0->sig_len == 0) {
    __assert_fail("new_sig->sig_len > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x124,"void generate_signature_test(void)");
  }
  rtr_mgr_bgpsec_free_signatures(local_1b0);
  local_1b0 = (rtr_signature_seg *)0x0;
  iVar4 = rtr_bgpsec_generate_signature(prVar6,wrong_private_key,&local_1b0);
  if (iVar4 != -3) {
    __assert_fail("result == RTR_BGPSEC_LOAD_PRIV_KEY_ERROR",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,300,"void generate_signature_test(void)");
  }
  if (local_1b0 != (rtr_signature_seg *)0x0) {
    __assert_fail("!new_sig",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x12e,"void generate_signature_test(void)");
  }
  spki_table_free(&table);
  free(psVar10);
  free(psVar9);
  rtr_mgr_bgpsec_free(prVar6);
  rtr_mgr_bgpsec_free_signatures(local_1b0);
  local_1b0 = (rtr_signature_seg *)0x0;
  prVar5 = rtr_mgr_bgpsec_nlri_new(3);
  prVar5->nlri_len = '\x18';
  prVar5->afi = 1;
  puVar2 = prVar5->nlri;
  puVar2[2] = '\x02';
  puVar2[0] = 0xc0;
  puVar2[1] = '\0';
  prVar6 = rtr_mgr_bgpsec_new('\x01','\x01',1,0xfbf0,0x10000,prVar5);
  prVar7 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar6,prVar7);
  spki_table_init(&table,(spki_update_fp)0x0);
  psVar9 = create_record(0x10000,ski1,spki1);
  psVar10 = create_record(0xfbf0,ski2,spki2);
  spki_table_add_entry(&table,psVar10);
  spki_table_add_entry(&table,psVar9);
  rtr_bgpsec_generate_signature(prVar6,private_key,&local_1b0);
  if (local_1b0->sig_len == 0) {
    __assert_fail("new_sig->sig_len > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x16c,"void originate_and_validate_test(void)");
  }
  *(undefined4 *)(local_1b0->ski + 0x10) = ski2._16_4_;
  uVar3 = ski2._8_8_;
  *(undefined8 *)local_1b0->ski = ski2._0_8_;
  *(undefined8 *)(local_1b0->ski + 8) = uVar3;
  iVar4 = rtr_mgr_bgpsec_prepend_sig_seg(prVar6,local_1b0);
  if (iVar4 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x173,"void originate_and_validate_test(void)");
  }
  iVar4 = rtr_bgpsec_validate_as_path(prVar6,&table);
  if (iVar4 != 1) {
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x177,"void originate_and_validate_test(void)");
  }
  spki_table_free(&table);
  free(psVar10);
  free(psVar9);
  rtr_mgr_bgpsec_free(prVar6);
  iVar4 = rtr_bgpsec_get_version();
  if (iVar4 == 0) {
    iVar4 = rtr_bgpsec_get_version();
    if (iVar4 == 1) {
      __assert_fail("rtr_bgpsec_get_version() != 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x188,"void bgpsec_version_and_algorithms_test(void)");
    }
    iVar4 = rtr_bgpsec_has_algorithm_suite('\x01');
    if (iVar4 != 0) {
      __assert_fail("rtr_bgpsec_has_algorithm_suite(1) == RTR_BGPSEC_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x18b,"void bgpsec_version_and_algorithms_test(void)");
    }
    iVar4 = rtr_bgpsec_has_algorithm_suite('\x02');
    if (iVar4 != -1) {
      __assert_fail("rtr_bgpsec_has_algorithm_suite(2) == RTR_BGPSEC_ERROR",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x18d,"void bgpsec_version_and_algorithms_test(void)");
    }
    table.hashtable.bucket[0] = (tommy_hashlin_node **)0x0;
    iVar4 = rtr_bgpsec_get_algorithm_suites((uint8_t **)&table);
    if (iVar4 == 1) {
      if (*(char *)table.hashtable.bucket[0] != '\x01') {
        __assert_fail("suites[i] == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                      ,0x195,"void bgpsec_version_and_algorithms_test(void)");
      }
      puts("Test Sucessful!");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return 0;
      }
      __stack_chk_fail();
    }
    __assert_fail("suites_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x193,"void bgpsec_version_and_algorithms_test(void)");
  }
  __assert_fail("rtr_bgpsec_get_version() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                ,0x186,"void bgpsec_version_and_algorithms_test(void)");
}

Assistant:

int main(void)
{
	validate_bgpsec_path_test();
	generate_signature_test();
	originate_and_validate_test();
	bgpsec_version_and_algorithms_test();
	printf("Test Sucessful!\n");
	return EXIT_SUCCESS;
}